

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsgfn(prscxdef *ctx,prsndef *n,int cnt)

{
  ushort uVar1;
  long lVar2;
  errcxdef *ctx_00;
  char *facility;
  undefined1 in_DL;
  long in_RSI;
  tokdef *in_RDI;
  prscxdef *unaff_retaddr;
  tokdef *t;
  undefined8 in_stack_ffffffffffffffd8;
  ushort uVar3;
  emtcxdef *in_stack_ffffffffffffffe0;
  
  uVar3 = (ushort)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  if (((*(int *)(in_RSI + 4) == 0) && (*(int *)(in_RSI + 8) == 0x38)) &&
     ((*(char *)(in_RSI + 0x48) == '\0' || (*(char *)(in_RSI + 0x48) != '\x04')))) {
    ctx_00 = (errcxdef *)(in_RSI + 8);
    prsdef(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
    facility = (char *)(ulong)((byte)ctx_00->errcxbuf[0x24] - 1);
    switch(facility) {
    case (char *)0x0:
    case (char *)0x7:
      emtres((emtcxdef *)ctx_00,0);
      uVar3 = (ushort)((ulong)facility >> 0x30);
      lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
      *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x11;
      break;
    default:
      errlogf(ctx_00,facility,0);
      uVar3 = (ushort)((ulong)facility >> 0x30);
      break;
    case (char *)0x5:
      emtres((emtcxdef *)ctx_00,0);
      uVar3 = (ushort)((ulong)facility >> 0x30);
      lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
      *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x1e;
      break;
    case (char *)0x9:
      emtres((emtcxdef *)ctx_00,0);
      uVar3 = (ushort)((ulong)facility >> 0x30);
      lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
      *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x48;
    }
    emtres((emtcxdef *)ctx_00,uVar3);
    lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
    *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar2 + (int)(uint)uVar1) = in_DL;
    emtres((emtcxdef *)ctx_00,uVar3);
    oswp2((void *)(*(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18) +
                  (long)(int)(uint)*(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12)),
          (uint)*(ushort *)(ctx_00->errcxbuf + 0x26));
    *(short *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) =
         *(short *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) + 2;
  }
  else {
    prsgexp(ctx,n);
    emtres(in_stack_ffffffffffffffe0,uVar3);
    lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
    *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x26;
    emtres(in_stack_ffffffffffffffe0,uVar3);
    lVar2 = *(long *)(*(long *)(in_RDI->toknam + 0x10) + 0x18);
    uVar1 = *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12);
    *(ushort *)(*(long *)(in_RDI->toknam + 0x10) + 0x12) = uVar1 + 1;
    *(undefined1 *)(lVar2 + (int)(uint)uVar1) = in_DL;
  }
  return;
}

Assistant:

static void prsgfn(prscxdef *ctx, prsndef *n, int cnt)
{
    if (n->prsnnlf == 0 && n->prsnv.prsnvt.toktyp == TOKTSYMBOL
        && (n->prsnv.prsnvt.toksym.tokstyp == TOKSTUNK
            || n->prsnv.prsnvt.toksym.tokstyp != TOKSTLOCAL))
    {
        tokdef *t = &n->prsnv.prsnvt;
        
        /* if symbol is undefined, add to symbol table as a new function */
        prsdef(ctx, t, TOKSTFWDFN);
        
        /* non-local-var symbol: interpret as a function */
        switch(t->toksym.tokstyp)
        {
        case TOKSTFUNC:
        case TOKSTFWDFN:
            emtop(ctx->prscxemt, OPCCALL);
            break;
        case TOKSTEXTERN:
            emtop(ctx->prscxemt, OPCCALLEXT);
            break;
        case TOKSTBIFN:
            emtop(ctx->prscxemt, OPCBUILTIN);
            break;
        default:
            errlog(ctx->prscxerr, ERR_REQFCN);
        }
        emtbyte(ctx->prscxemt, cnt);            /* emit argument count byte */
        emtint2(ctx->prscxemt, t->toksym.toksval);
    }
    else
    {
        /* expression - evaluate, and assume it yields a function pointer */
        prsgexp(ctx, n);
        emtop(ctx->prscxemt, OPCPTRCALL);
        emtbyte(ctx->prscxemt, cnt);                 /* argument count byte */
    }
}